

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::SocketWriter::MakeConnection(SocketWriter *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  char *__service;
  GTestLog local_74;
  addrinfo *local_70;
  addrinfo *cur_addr;
  addrinfo *paStack_60;
  int error_num;
  addrinfo *servinfo;
  addrinfo hints;
  GTestLog local_14;
  SocketWriter *local_10;
  SocketWriter *this_local;
  
  local_10 = this;
  bVar1 = IsTrue(this->sockfd_ == -1);
  if (!bVar1) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/blt/thirdparty_builtin/googletest-master-2020-01-07/googletest/src/gtest.cc"
                       ,0x11aa);
    poVar3 = GTestLog::GetStream(&local_14);
    poVar3 = std::operator<<(poVar3,"Condition sockfd_ == -1 failed. ");
    std::operator<<(poVar3,"MakeConnection() can\'t be called when there is already a connection.");
    GTestLog::~GTestLog(&local_14);
  }
  memset(&servinfo,0,0x30);
  servinfo._4_4_ = 0;
  hints.ai_flags = 1;
  paStack_60 = (addrinfo *)0x0;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  __service = (char *)std::__cxx11::string::c_str();
  cur_addr._4_4_ = getaddrinfo(pcVar4,__service,(addrinfo *)&servinfo,&stack0xffffffffffffffa0);
  if (cur_addr._4_4_ != 0) {
    GTestLog::GTestLog((GTestLog *)&cur_addr,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/blt/thirdparty_builtin/googletest-master-2020-01-07/googletest/src/gtest.cc"
                       ,0x11b8);
    poVar3 = GTestLog::GetStream((GTestLog *)&cur_addr);
    poVar3 = std::operator<<(poVar3,"stream_result_to: getaddrinfo() failed: ");
    pcVar4 = gai_strerror(cur_addr._4_4_);
    std::operator<<(poVar3,pcVar4);
    GTestLog::~GTestLog((GTestLog *)&cur_addr);
  }
  for (local_70 = paStack_60; this->sockfd_ == -1 && local_70 != (addrinfo *)0x0;
      local_70 = local_70->ai_next) {
    iVar2 = socket(local_70->ai_family,local_70->ai_socktype,local_70->ai_protocol);
    this->sockfd_ = iVar2;
    if ((this->sockfd_ != -1) &&
       (iVar2 = connect(this->sockfd_,local_70->ai_addr,local_70->ai_addrlen), iVar2 == -1)) {
      close(this->sockfd_);
      this->sockfd_ = -1;
    }
  }
  freeaddrinfo(paStack_60);
  if (this->sockfd_ == -1) {
    GTestLog::GTestLog(&local_74,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/blt/thirdparty_builtin/googletest-master-2020-01-07/googletest/src/gtest.cc"
                       ,0x11cd);
    poVar3 = GTestLog::GetStream(&local_74);
    poVar3 = std::operator<<(poVar3,"stream_result_to: failed to connect to ");
    poVar3 = std::operator<<(poVar3,(string *)&this->host_name_);
    poVar3 = std::operator<<(poVar3,":");
    std::operator<<(poVar3,(string *)&this->port_num_);
    GTestLog::~GTestLog(&local_74);
  }
  return;
}

Assistant:

void StreamingListener::SocketWriter::MakeConnection() {
  GTEST_CHECK_(sockfd_ == -1)
      << "MakeConnection() can't be called when there is already a connection.";

  addrinfo hints;
  memset(&hints, 0, sizeof(hints));
  hints.ai_family = AF_UNSPEC;    // To allow both IPv4 and IPv6 addresses.
  hints.ai_socktype = SOCK_STREAM;
  addrinfo* servinfo = nullptr;

  // Use the getaddrinfo() to get a linked list of IP addresses for
  // the given host name.
  const int error_num = getaddrinfo(
      host_name_.c_str(), port_num_.c_str(), &hints, &servinfo);
  if (error_num != 0) {
    GTEST_LOG_(WARNING) << "stream_result_to: getaddrinfo() failed: "
                        << gai_strerror(error_num);
  }

  // Loop through all the results and connect to the first we can.
  for (addrinfo* cur_addr = servinfo; sockfd_ == -1 && cur_addr != nullptr;
       cur_addr = cur_addr->ai_next) {
    sockfd_ = socket(
        cur_addr->ai_family, cur_addr->ai_socktype, cur_addr->ai_protocol);
    if (sockfd_ != -1) {
      // Connect the client socket to the server socket.
      if (connect(sockfd_, cur_addr->ai_addr, cur_addr->ai_addrlen) == -1) {
        close(sockfd_);
        sockfd_ = -1;
      }
    }
  }

  freeaddrinfo(servinfo);  // all done with this structure

  if (sockfd_ == -1) {
    GTEST_LOG_(WARNING) << "stream_result_to: failed to connect to "
                        << host_name_ << ":" << port_num_;
  }
}